

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asciimidi.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  string *psVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int local_17c;
  int i;
  int filecount;
  undefined1 local_168 [8];
  Options options;
  MidiFile midifile;
  char **argv_local;
  int argc_local;
  
  smf::MidiFile::MidiFile
            ((MidiFile *)
             &options.m_extraArgv_strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  smf::Options::Options((Options *)local_168);
  checkOptions((Options *)local_168,argc,argv);
  iVar1 = smf::Options::getArgCount((Options *)local_168);
  if (iVar1 == 0) {
    smf::MidiFile::read((MidiFile *)
                        &options.m_extraArgv_strings.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0x17f3c0,__buf,in_RCX);
    printAscii((MidiFile *)
               &options.m_extraArgv_strings.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(Options *)local_168);
  }
  else {
    for (local_17c = 1; local_17c <= iVar1; local_17c = local_17c + 1) {
      psVar2 = smf::Options::getArg_abi_cxx11_((Options *)local_168,local_17c);
      smf::MidiFile::read((MidiFile *)
                          &options.m_extraArgv_strings.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(int)psVar2,__buf_00,
                          in_RCX);
      printAscii((MidiFile *)
                 &options.m_extraArgv_strings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(Options *)local_168);
      if (local_17c < iVar1) {
        std::operator<<((ostream *)&std::cout,"\n\n\n");
      }
    }
  }
  smf::Options::~Options((Options *)local_168);
  smf::MidiFile::~MidiFile
            ((MidiFile *)
             &options.m_extraArgv_strings.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	MidiFile midifile;
	Options options;
	checkOptions(options, argc, argv);
	int filecount = options.getArgCount();
	if (filecount == 0) {
			midifile.read(cin);
			printAscii(midifile, options);
	} else {
		for (int i=1; i<=filecount; i++) {
			midifile.read(options.getArg(i));
			printAscii(midifile, options);
			if (i < filecount) {
				cout << "\n\n\n";
			}
		}
	}

	return 0;
}